

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

void Abc_FrameReplacePoEquivs(Abc_Frame_t *pAbc,Vec_Ptr_t **pvPoEquivs)

{
  Vec_Ptr_t *__ptr;
  void *__ptr_00;
  long lVar1;
  
  __ptr = pAbc->vPoEquivs;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (0 < __ptr->nSize) {
      lVar1 = 0;
      do {
        __ptr_00 = __ptr->pArray[lVar1];
        if (__ptr_00 != (void *)0x0) {
          if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr_00 + 8));
            *(undefined8 *)((long)__ptr_00 + 8) = 0;
          }
          free(__ptr_00);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
  }
  pAbc->vPoEquivs = *pvPoEquivs;
  *pvPoEquivs = (Vec_Ptr_t *)0x0;
  return;
}

Assistant:

void Abc_FrameReplacePoEquivs( Abc_Frame_t * pAbc, Vec_Ptr_t ** pvPoEquivs )
{
    if ( pAbc->vPoEquivs )
        Vec_VecFree( (Vec_Vec_t *)pAbc->vPoEquivs );
    pAbc->vPoEquivs = *pvPoEquivs;
    *pvPoEquivs = NULL;
}